

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.cc
# Opt level: O0

float GD::sensitivity<false,true,true,0ul,1ul,2ul>(gd *g,base_learner *param_2,example *ec)

{
  example *in_RDX;
  gd *in_RSI;
  float fVar1;
  float fVar2;
  example *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  float in_stack_ffffffffffffffe4;
  
  fVar1 = get_scale<0ul>(in_RSI,in_RDX,in_stack_ffffffffffffffe4);
  fVar2 = sensitivity<false,true,true,0ul,1ul,2ul,true>
                    ((gd *)CONCAT44(fVar1,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8);
  return fVar1 * fVar2;
}

Assistant:

float sensitivity(gd& g, base_learner& /* base */, example& ec)
{
  return get_scale<adaptive>(g, ec, 1.) *
      sensitivity<sqrt_rate, feature_mask_off, adax, adaptive, normalized, spare, true>(g, ec);
}